

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger.hpp
# Opt level: O0

void __thiscall LoaderLogger::~LoaderLogger(LoaderLogger *this)

{
  LoaderLogger *this_local;
  
  DebugUtilsData::~DebugUtilsData(&this->data_);
  std::
  unordered_map<XrInstance_T_*,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<XrInstance_T_*>,_std::equal_to<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
  ::~unordered_map(&this->_recordersByInstance);
  std::
  vector<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
  ::~vector(&this->_recorders);
  return;
}

Assistant:

static LoaderLogger& GetInstance() {
        static LoaderLogger instance;
        return instance;
    }